

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O3

void gen_field_match(fb_output_t *out,fb_compound_type_t *ct,void *data,int hint,int n)

{
  ushort uVar1;
  uint16_t uVar2;
  ushort uVar3;
  short sVar4;
  int iVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  uint uVar18;
  int iVar19;
  undefined8 uVar20;
  byte bVar21;
  uint uVar22;
  byte bVar24;
  ulong uVar25;
  undefined *puVar26;
  undefined8 uVar27;
  bool bVar28;
  char *pcVar29;
  byte bVar30;
  fb_scope_t *scope;
  char cVar31;
  bool bVar32;
  bool bVar33;
  char cVar34;
  bool bVar35;
  double dVar36;
  fb_scoped_name_t snref;
  fb_symbol_text_t scope_name;
  ulong local_2d8;
  char *local_288;
  char *local_278;
  char local_258 [104];
  fb_scoped_name_t local_1f0;
  char local_108 [216];
  ulong uVar23;
  fb_output_t *out_00;
  
  bVar17 = false;
  bVar30 = 0;
  println(out,"buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, %d);",n);
  println(out,"if (mark != buf) {");
  out->indent = out->indent + 1;
  memset(&local_1f0,0,0xe8);
  scope = ct->scope;
  __flatcc_fb_copy_scope(scope,local_108);
  uVar1 = *(ushort *)((long)data + 0x28);
  if (uVar1 < 0x11) {
    bVar15 = false;
    bVar30 = 0;
    if ((0x10500U >> (uVar1 & 0x1f) & 1) != 0) {
      bVar15 = true;
      bVar30 = 1;
    }
  }
  else {
    bVar15 = false;
  }
  uVar2 = (ct->symbol).kind;
  uVar3 = *(ushort *)((long)data + 0x74);
  bVar14 = true;
  switch(uVar1) {
  case 8:
    cVar34 = *(long *)((long)data + 0x90) != 0;
    iVar5 = *(int *)((long)data + 0x18);
    bVar24 = (byte)((ushort)*(undefined2 *)((long)data + 0x70) >> 8);
    bVar21 = bVar24 >> 2 & 1;
    bVar24 = bVar24 >> 3 & 1;
    bVar13 = false;
    bVar28 = false;
    goto LAB_001148d9;
  case 9:
    iVar5 = *(int *)((long)data + 0x18);
    bVar13 = false;
    bVar28 = false;
    goto LAB_00114870;
  case 10:
  case 0xb:
    bVar14 = false;
    bVar17 = true;
  default:
    bVar33 = false;
    bVar32 = false;
    bVar28 = false;
LAB_0011480f:
    bVar13 = false;
    bVar12 = false;
    bVar21 = 0;
    bVar24 = 0;
    cVar34 = false;
    bVar10 = false;
    local_2d8 = 0;
    iVar5 = 0;
    break;
  case 0xf:
  case 0x10:
  case 0x14:
    scope = (fb_scope_t *)(*(fb_symbol_t **)((long)data + 0x18))[1].link;
    __flatcc_fb_scoped_symbol_name(scope,*(fb_symbol_t **)((long)data + 0x18),&local_1f0);
    sVar4 = *(short *)(*(long *)((long)data + 0x18) + 0x10);
    bVar32 = sVar4 == 1;
    bVar33 = sVar4 == 0;
    bVar28 = hint == 0 && sVar4 == 4;
    if (sVar4 != 3) {
      bVar17 = false;
      goto LAB_0011480f;
    }
    iVar5 = *(int *)(*(long *)((long)data + 0x18) + 0x50);
    bVar13 = true;
LAB_00114870:
    bVar21 = 0;
    bVar24 = 0;
    cVar34 = false;
LAB_001148d9:
    bVar14 = true;
    bVar17 = false;
    bVar33 = false;
    bVar32 = false;
    bVar12 = true;
    bVar10 = false;
    local_2d8 = 0;
    break;
  case 0x11:
    iVar5 = *(int *)((long)data + 0x18);
    local_2d8 = (ulong)*(uint *)((long)data + 0x2c);
    bVar17 = false;
    bVar12 = true;
    bVar13 = false;
    bVar33 = false;
    bVar32 = false;
    bVar28 = false;
    bVar21 = 0;
    bVar24 = 0;
    cVar34 = false;
    bVar10 = true;
  }
  if (*(short *)((long)data + 0x28) == 0x14) {
    if (uVar2 != 1) {
LAB_00115872:
      __assert_fail("is_struct_container",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x1df,
                    "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)")
      ;
    }
    local_2d8 = (ulong)*(uint *)((long)data + 0x2c);
    bVar10 = true;
  }
  if (bVar21 != 0 || bVar24 != 0) {
    bVar15 = false;
    bVar12 = false;
    cVar34 = false;
    if (!(bool)(bVar30 & iVar5 == 4)) {
      gen_field_match_cold_1();
      goto LAB_00115896;
    }
  }
  bVar11 = !bVar15;
  if (hint != 0) {
    bVar12 = false;
    bVar15 = false;
  }
  bVar16 = bVar15;
  if (bVar28) {
    bVar16 = false;
  }
  bVar30 = iVar5 == 0xc & bVar10 & bVar12;
  out_00 = (fb_output_t *)CONCAT71((int7)((ulong)scope >> 8),bVar30);
  if (bVar30 != 0) {
    bVar12 = false;
    bVar10 = false;
  }
  if ((bool)cVar34 != false) {
    out_00 = out;
    println(out,"if (buf != end && *buf == \'[\') { /* begin nested */");
    out->indent = out->indent + 1;
  }
  uVar22 = iVar5 - 1;
  uVar23 = (ulong)uVar22;
  uVar18 = 0x9ffU >> ((byte)uVar22 & 0x1f) ^ 1;
  local_288 = "n/a";
  local_278 = "n/a";
  do {
    cVar31 = cVar34;
    if (cVar31 == '\x02') {
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x202,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      bVar8 = false;
      println(out,"} else { /* nested */");
      out->indent = out->indent + 1;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)(*(fb_symbol_t **)((long)data + 0x90))[1].link,
                 *(fb_symbol_t **)((long)data + 0x90),&local_1f0);
      bVar12 = true;
      if (*(short *)(*(long *)((long)data + 0x90) + 0x10) == 0) {
        bVar33 = true;
        bVar12 = bVar32;
      }
      out_00 = out;
      println(out,"if (flatcc_builder_start_buffer(ctx->ctx, 0, 0, 0)) goto failed;");
      bVar9 = !bVar12;
      bVar35 = hint == 0 && bVar9;
      bVar32 = bVar12;
      if (bVar10) {
        bVar16 = false;
LAB_00114c72:
        bVar12 = false;
        println(out,"size_t count = %d;",local_2d8);
        out_00 = out;
        println(out,"void *base = (void *)((size_t)struct_base + %lu);",
                *(undefined8 *)((long)data + 0x78));
        bVar8 = true;
        bVar7 = true;
      }
      else {
        bVar7 = true;
        bVar12 = false;
        bVar16 = false;
      }
    }
    else {
      bVar9 = !bVar32;
      bVar35 = (!bVar12 && hint == 0) && !bVar32;
      bVar7 = !bVar12;
      if (!bVar7) {
        if (0xb < uVar22) {
          gen_field_match_cold_2();
          goto LAB_001157a4;
        }
        local_288 = &DAT_001419ac + *(int *)(&DAT_001419ac + uVar23 * 4);
        local_278 = &DAT_001419dc + *(int *)(&DAT_001419dc + uVar23 * 4);
      }
      if (bVar16) {
        if ((!bVar12 && hint == 0) && !bVar32) {
          out_00 = out;
          println(out,"if (flatcc_builder_start_offset_vector(ctx->ctx)) goto failed;");
        }
        else {
          uVar25 = *(ulong *)((long)data + 0x80);
          if (uVar25 == 0) {
            uVar20 = 0xffffffff;
            uVar25 = 0;
          }
          else {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar25;
            uVar20 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / auVar6,0);
          }
          out_00 = out;
          println(out,
                  "if (flatcc_builder_start_vector(ctx->ctx, %lu, %hu, UINT64_C(%lu))) goto failed;"
                  ,uVar25,(ulong)(uint)(int)*(short *)((long)data + 0x72),uVar20);
        }
      }
      if (bVar10) {
        if (!bVar12) goto LAB_00114c72;
        bVar7 = false;
        println(out,"size_t count = %d;",local_2d8);
        out_00 = out;
        println(out,"%s *base = (%s *)((size_t)struct_base + %lu);",local_278,local_278,
                *(undefined8 *)((long)data + 0x78));
        bVar8 = true;
      }
      else {
        bVar8 = false;
      }
    }
    if (bVar30 != 0) {
      println(out,"char *base = (char *)((size_t)struct_base + %lu);",
              *(undefined8 *)((long)data + 0x78));
      out_00 = out;
      println(out,"buf = flatcc_json_parser_char_array(ctx, buf, end, base, %d);",local_2d8);
    }
    if (bVar16 || bVar10) {
      println(out,"buf = flatcc_json_parser_array_start(ctx, buf, end, &more);");
      out_00 = out;
      println(out,"while (more) {");
      out->indent = out->indent + 1;
    }
    if (!bVar7) {
      println(out,"%s val = 0;",local_278);
      println(out,"static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {");
      out->indent = out->indent + 2;
      if (bVar13) {
        println(out,"%s_parse_json_enum,",&local_1f0);
      }
      println(out,"%s_local_%sjson_parser_enum,",out->S->basename,local_108);
      out_00 = out;
      println(out,"%s_global_json_parser_enum, 0 };",out->S->basename);
      iVar19 = out->indent;
      if ((iVar19 == 0) || (out->indent = iVar19 + -1, iVar19 + -1 == 0)) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x246,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = iVar19 + -2;
    }
    if (!(bool)(!bVar16 | bVar35)) {
      out_00 = out;
      println(out,"if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;");
    }
    if (uVar2 == 1) {
      if (bVar30 == 0 && !bVar8) {
        out_00 = out;
        println(out,"pval = (void *)((size_t)struct_base + %lu);",*(undefined8 *)((long)data + 0x78)
               );
      }
    }
    else if (!bVar9 && !bVar16) {
      out_00 = out;
      println(out,"if (!(pval = flatcc_builder_table_add(ctx->ctx, %lu, %lu, %u))) goto failed;",
              *(undefined8 *)((long)data + 0x88),*(undefined8 *)((long)data + 0x80),
              (ulong)*(ushort *)((long)data + 0x72));
    }
    if (bVar7) {
      if (!bVar9) {
        if (!bVar8) {
          pcVar29 = "buf = %s_parse_json_struct_inline(ctx, buf, end, pval);";
LAB_00115099:
          out_00 = out;
          println(out,pcVar29,&local_1f0);
          goto LAB_00115332;
        }
        println(out,"if (count) {");
        out->indent = out->indent + 1;
        println(out,"buf = %s_parse_json_struct_inline(ctx, buf, end, base);",&local_1f0);
        println(out,"--count;");
        println(out,"base = (void *)((size_t)base + %lu);",
                *(undefined8 *)(*(long *)((long)data + 0x18) + 0xc0));
        if (out->indent == 0) {
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x27f,
                        "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                       );
        }
        out->indent = out->indent + -1;
        println(out,"} else if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {");
        out->indent = out->indent + 1;
        println(out,
                "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);"
               );
        iVar19 = out->indent;
        if (iVar19 == 0) {
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x281,
                        "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                       );
        }
        goto LAB_0011531d;
      }
      if (!bVar14) {
        pcVar29 = "buf = flatcc_json_parser_build_string(ctx, buf, end, &ref);";
        goto LAB_0011532b;
      }
      if (bVar21 != 0 || bVar24 != 0) {
        out_00 = out;
        println(out,"buf = flatcc_json_parser_build_uint8_vector_base64(ctx, buf, end, &ref, %u);",
                (ulong)(bVar21 ^ 1));
        goto LAB_00115332;
      }
      if (bVar33) {
        pcVar29 = "buf = %s_parse_json_table(ctx, buf, end, &ref);";
        goto LAB_00115099;
      }
      if (bVar28) {
        uVar20 = *(undefined8 *)((long)data + 0x88);
        uVar27 = *(undefined8 *)((long)data + 0xa0);
        if ((bool)(bVar28 & bVar15)) {
          pcVar29 = 
          "buf = flatcc_json_parser_union_vector(ctx, buf, end, %lu, %lu, h_unions, %s_parse_json_union);"
          ;
        }
        else {
          pcVar29 = 
          "buf = flatcc_json_parser_union(ctx, buf, end, %lu, %lu, h_unions, %s_parse_json_union);";
        }
LAB_001155a0:
        out_00 = out;
        println(out,pcVar29,uVar27,uVar20,&local_1f0);
      }
      else if (hint == 0) {
        if (bVar30 == 0 && !bVar16) {
          gen_field_match_cold_7();
          println(out_00,"buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);");
          return;
        }
      }
      else {
        println(out,"static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {");
        out->indent = out->indent + 2;
        println(out,"%s_parse_json_enum,",&local_1f0);
        println(out,"%s_local_%sjson_parser_enum,",out->S->basename,local_108);
        println(out,"%s_global_json_parser_enum, 0 };",out->S->basename);
        iVar19 = out->indent;
        if ((iVar19 == 0) || (out->indent = iVar19 + -1, iVar19 + -1 == 0)) {
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x29a,
                        "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                       );
        }
        out->indent = iVar19 + -2;
        uVar20 = *(undefined8 *)((long)data + 0x88);
        uVar27 = *(undefined8 *)((long)data + 0xa0);
        if (hint == 0 || bVar11) {
          pcVar29 = 
          "buf = flatcc_json_parser_union_type(ctx, buf, end, %lu, %lu, h_unions, symbolic_parsers, %s_parse_json_union);"
          ;
          goto LAB_001155a0;
        }
        out_00 = out;
        println(out,
                "buf = flatcc_json_parser_union_type_vector(ctx, buf, end, %lu, %lu, h_unions, symbolic_parsers, %s_parse_json_union, %s_json_union_accept_type);"
                ,uVar27,uVar20,&local_1f0,&local_1f0);
      }
      goto LAB_00115332;
    }
    println(out,"buf = flatcc_json_parser_%s(ctx, (mark = buf), end, &val);",local_288);
    println(out,"if (mark == buf) {");
    out->indent = out->indent + 1;
    println(out,
            "buf = flatcc_json_parser_symbolic_%s(ctx, (mark = buf), end, symbolic_parsers, &val);",
            local_288);
    println(out,"if (buf == mark || buf == end) goto failed;");
    if (out->indent == 0) {
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x25c,
                    "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)")
      ;
    }
    out->indent = out->indent + -1;
    println(out,"}");
    bVar9 = (bool)(uVar2 == 1 | bVar16);
    if (bVar9 || (bVar21 != 0 || bVar24 != 0)) goto LAB_0011521f;
    if ((uVar3 & 1) != 0) goto LAB_001151f6;
    switch(*(undefined2 *)((long)data + 0x58)) {
    case 4:
      dVar36 = *(double *)((long)data + 0x48);
      if (iVar5 == 0xb) {
        dVar36 = (double)(float)dVar36;
        pcVar29 = "%#.9gf";
      }
      else {
        pcVar29 = "%#.17g";
      }
      iVar19 = sprintf(local_258,pcVar29,dVar36);
      break;
    case 5:
      if ((0xb < uVar22) || ((uVar18 & 1) != 0)) {
LAB_00115868:
        gen_field_match_cold_4();
        goto switchD_00114f76_default;
      }
      puVar26 = (&PTR_anon_var_dwarf_40d1_00153bf0)[uVar23];
      uVar20 = *(undefined8 *)((long)data + 0x48);
      pcVar29 = "%s(%ld)";
      goto LAB_00115178;
    case 6:
      if ((0xb < uVar22) || ((uVar18 & 1) != 0)) {
LAB_00115863:
        gen_field_match_cold_5();
        goto LAB_00115868;
      }
      puVar26 = (&PTR_anon_var_dwarf_40d1_00153bf0)[uVar23];
      uVar20 = *(undefined8 *)((long)data + 0x48);
      pcVar29 = "%s(%lu)";
LAB_00115178:
      iVar19 = sprintf(local_258,pcVar29,puVar26,uVar20);
      break;
    case 7:
      if ((0xb < uVar22) || ((uVar18 & 1) != 0)) {
        gen_field_match_cold_3();
        goto LAB_00115863;
      }
      iVar19 = sprintf(local_258,"%s(%u)",(&PTR_anon_var_dwarf_40d1_00153bf0)[uVar23],
                       (ulong)*(byte *)((long)data + 0x48));
      break;
    default:
switchD_00114f76_default:
      gen_field_match_cold_6();
      goto LAB_00115872;
    }
    if (iVar19 == 0) goto LAB_00115687;
    println(out,"if (val != %s || (ctx->flags & flatcc_json_parser_f_force_add)) {",local_258);
    out->indent = out->indent + 1;
LAB_001151f6:
    println(out,"if (!(pval = flatcc_builder_table_add(ctx->ctx, %lu, %lu, %hu))) goto failed;",
            *(undefined8 *)((long)data + 0x88),*(undefined8 *)((long)data + 0x80),
            (ulong)(uint)(int)*(short *)((long)data + 0x72));
LAB_0011521f:
    if (bVar8) {
      println(out,"if (count) {");
      out->indent = out->indent + 1;
      println(out,"%s%s_write_to_pe(base, val);",out,local_288);
      println(out,"--count;");
      println(out,"++base;");
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x270,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"} else if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {");
      out->indent = out->indent + 1;
      println(out,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);"
             );
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x272,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      out_00 = out;
      println(out,"}");
    }
    else {
      out_00 = out;
      println(out,"%s%s_write_to_pe(pval, val);",out,local_288);
    }
    if (!bVar9 && (uVar3 & 1) == 0) {
      iVar19 = out->indent;
      if (iVar19 == 0) {
LAB_001157a4:
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x277,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
LAB_0011531d:
      out->indent = iVar19 + -1;
      pcVar29 = "}";
LAB_0011532b:
      out_00 = out;
      println(out,pcVar29);
    }
LAB_00115332:
    if (bVar16) {
      if (bVar35) {
        println(out,
                "if (!ref || !(pref = flatcc_builder_extend_offset_vector(ctx->ctx, 1))) goto failed;"
               );
        println(out,"*pref = ref;");
      }
      println(out,"buf = flatcc_json_parser_array_end(ctx, buf, end, &more);");
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x2ae,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"}");
      pcVar29 = "ref = flatcc_builder_end_vector(ctx->ctx);";
      if (bVar35) {
        pcVar29 = "ref = flatcc_builder_end_offset_vector(ctx->ctx);";
      }
      out_00 = out;
      println(out,pcVar29);
    }
    if (bVar8) {
      println(out,"buf = flatcc_json_parser_array_end(ctx, buf, end, &more);");
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x2b7,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"}");
      println(out,"if (count) {");
      out->indent = out->indent + 1;
      println(out,"if (ctx->flags & flatcc_json_parser_f_reject_array_underflow) {");
      out->indent = out->indent + 1;
      println(out,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_underflow);"
             );
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,699,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"}");
      if (bVar7) {
        println(out,"memset(base, 0, count * %lu);",
                *(undefined8 *)(*(long *)((long)data + 0x18) + 0xc0));
      }
      else {
        println(out,"memset(base, 0, count * sizeof(*base));");
      }
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x2c1,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      out_00 = out;
      println(out,"}");
    }
    cVar34 = '\x02';
  } while (cVar31 == '\x01');
  if (cVar31 == '\x02') {
    println(out,"if (!ref) goto failed;");
    println(out,"ref = flatcc_builder_end_buffer(ctx->ctx, ref);");
    if (out->indent == 0) {
LAB_00115896:
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x2ca,
                    "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)")
      ;
    }
    out->indent = out->indent + -1;
    println(out,"} /* end nested */");
  }
  if (((bVar17 || bVar21 != 0) || bVar24 != 0) || ((bVar16 || cVar31 != '\0') || bVar33)) {
    println(out,"if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, %lu))) goto failed;"
            ,*(undefined8 *)((long)data + 0x88));
    println(out,"*pref = ref;");
  }
LAB_00115687:
  if (out->indent != 0) {
    out->indent = out->indent + -1;
    println(out,"} else {");
    out->indent = out->indent + 1;
    return;
  }
  __assert_fail("out->indent",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                ,0x2d8,"void gen_field_match(fb_output_t *, fb_compound_type_t *, void *, int, int)"
               );
}

Assistant:

static void gen_field_match(fb_output_t *out, fb_compound_type_t *ct, void *data, int hint, int n)
{
    println(out, "buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, %d);", n);
    println(out, "if (mark != buf) {"); indent();
    gen_field_match_handler(out, ct, data, hint);
    unindent(); println(out, "} else {"); indent();
}